

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::UpdateImpl(cmCTestGIT *this)

{
  pointer pcVar1;
  cmCTest *this_00;
  bool bVar2;
  uint uVar3;
  char *extraout_RDX;
  char *pcVar4;
  char *pcVar5;
  string_view value;
  string top_dir;
  OutputLogger submodule_out;
  string init_submodules;
  char *git_submodule_sync [5];
  OutputLogger submodule_err;
  char *git_submodule [5];
  
  bVar2 = UpdateInternal(this);
  if (!bVar2) {
    return false;
  }
  FindTopDir_abi_cxx11_(&top_dir,this);
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  uVar3 = GetGitVersion(this);
  if (uVar3 < 0xa1d1c8) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &submodule_out,&top_dir,"/.gitmodules");
    bVar2 = cmsys::SystemTools::FileExists((string *)&submodule_out);
    std::__cxx11::string::~string((string *)&submodule_out);
    if (bVar2) {
      std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                      "Git < 1.6.5 cannot update submodules recursively\n");
    }
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = "--recursive";
  }
  uVar3 = GetGitVersion(this);
  if (uVar3 < 0xa4cf68) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &submodule_out,&top_dir,"/.gitmodules");
    bVar2 = cmsys::SystemTools::FileExists((string *)&submodule_out);
    std::__cxx11::string::~string((string *)&submodule_out);
    if (bVar2) {
      std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                      "Git < 1.8.1 cannot synchronize submodules recursively\n");
    }
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = "--recursive";
  }
  cmProcessTools::OutputLogger::OutputLogger
            (&submodule_out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&submodule_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-err> ");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)git_submodule_sync,"GITInitSubmodules",(allocator<char> *)git_submodule);
  cmCTest::GetCTestConfiguration(&init_submodules,this_00,(string *)git_submodule_sync);
  std::__cxx11::string::~string((string *)git_submodule_sync);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)init_submodules._M_dataplus._M_p;
  bVar2 = cmValue::IsOn((cmValue *)init_submodules._M_string_length,value);
  if (bVar2) {
    git_submodule_sync[1] = "submodule";
    git_submodule_sync[2] = "init";
    git_submodule_sync[3] = (char *)0x0;
    git_submodule_sync[0] = pcVar1;
    bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,git_submodule_sync,(OutputParser *)&submodule_out,
                                (OutputParser *)&submodule_err,top_dir._M_dataplus._M_p,Auto);
    if (bVar2) goto LAB_001d1804;
  }
  else {
LAB_001d1804:
    git_submodule_sync[1] = "submodule";
    git_submodule_sync[2] = "sync";
    git_submodule_sync[4] = (char *)0x0;
    git_submodule_sync[0] = pcVar1;
    git_submodule_sync[3] = pcVar5;
    bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,git_submodule_sync,(OutputParser *)&submodule_out,
                                (OutputParser *)&submodule_err,top_dir._M_dataplus._M_p,Auto);
    if (bVar2) {
      git_submodule[1] = "submodule";
      git_submodule[2] = "update";
      git_submodule[4] = (char *)0x0;
      git_submodule[0] = pcVar1;
      git_submodule[3] = pcVar4;
      bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,git_submodule,(OutputParser *)&submodule_out,
                                  (OutputParser *)&submodule_err,top_dir._M_dataplus._M_p,Auto);
      goto LAB_001d188e;
    }
  }
  bVar2 = false;
LAB_001d188e:
  std::__cxx11::string::~string((string *)&init_submodules);
  cmProcessTools::LineParser::~LineParser(&submodule_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&submodule_out.super_LineParser);
  std::__cxx11::string::~string((string *)&top_dir);
  return bVar2;
}

Assistant:

bool cmCTestGIT::UpdateImpl()
{
  if (!this->UpdateInternal()) {
    return false;
  }

  std::string top_dir = this->FindTopDir();
  const char* git = this->CommandLineTool.c_str();
  const char* recursive = "--recursive";
  const char* sync_recursive = "--recursive";

  // Git < 1.6.5 did not support submodule --recursive
  if (this->GetGitVersion() < cmCTestGITVersion(1, 6, 5, 0)) {
    recursive = nullptr;
    // No need to require >= 1.6.5 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.6.5 cannot update submodules recursively\n";
    }
  }

  // Git < 1.8.1 did not support sync --recursive
  if (this->GetGitVersion() < cmCTestGITVersion(1, 8, 1, 0)) {
    sync_recursive = nullptr;
    // No need to require >= 1.8.1 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.8.1 cannot synchronize submodules recursively\n";
    }
  }

  OutputLogger submodule_out(this->Log, "submodule-out> ");
  OutputLogger submodule_err(this->Log, "submodule-err> ");

  bool ret;

  std::string init_submodules =
    this->CTest->GetCTestConfiguration("GITInitSubmodules");
  if (cmIsOn(init_submodules)) {
    char const* git_submodule_init[] = { git, "submodule", "init", nullptr };
    ret = this->RunChild(git_submodule_init, &submodule_out, &submodule_err,
                         top_dir.c_str());

    if (!ret) {
      return false;
    }
  }

  char const* git_submodule_sync[] = { git, "submodule", "sync",
                                       sync_recursive, nullptr };
  ret = this->RunChild(git_submodule_sync, &submodule_out, &submodule_err,
                       top_dir.c_str());

  if (!ret) {
    return false;
  }

  char const* git_submodule[] = { git, "submodule", "update", recursive,
                                  nullptr };
  return this->RunChild(git_submodule, &submodule_out, &submodule_err,
                        top_dir.c_str());
}